

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O0

int readwbmp(_func_int_void_ptr *getin,void *in,Wbmp **return_wbmp)

{
  int iVar1;
  uint uVar2;
  Wbmp *ptr;
  int *piVar3;
  Wbmp *wbmp;
  int local_38;
  int pos;
  int pel;
  int byte;
  int col;
  int row;
  Wbmp **return_wbmp_local;
  void *in_local;
  _func_int_void_ptr *getin_local;
  
  ptr = (Wbmp *)gdMalloc(0x18);
  if (ptr == (Wbmp *)0x0) {
    getin_local._4_4_ = -1;
  }
  else {
    iVar1 = (*getin)(in);
    ptr->type = iVar1;
    if (ptr->type == 0) {
      iVar1 = skipheader(getin,in);
      if (iVar1 == 0) {
        iVar1 = getmbi(getin,in);
        ptr->width = iVar1;
        if (ptr->width == -1) {
          gdFree(ptr);
          getin_local._4_4_ = -1;
        }
        else {
          iVar1 = getmbi(getin,in);
          ptr->height = iVar1;
          if (ptr->height == -1) {
            gdFree(ptr);
            getin_local._4_4_ = -1;
          }
          else {
            iVar1 = overflow2(4,ptr->width);
            if ((iVar1 == 0) && (iVar1 = overflow2(ptr->width << 2,ptr->height), iVar1 == 0)) {
              piVar3 = (int *)gdMalloc((long)ptr->width * 4 * (long)ptr->height);
              ptr->bitmap = piVar3;
              if (piVar3 == (int *)0x0) {
                gdFree(ptr);
                getin_local._4_4_ = -1;
              }
              else {
                wbmp._4_4_ = 0;
                for (byte = 0; byte < ptr->height; byte = byte + 1) {
                  pel = 0;
                  while (pel < ptr->width) {
                    uVar2 = (*getin)(in);
                    for (local_38 = 7; -1 < local_38; local_38 = local_38 + -1) {
                      if (pel < ptr->width) {
                        if ((uVar2 & 1 << ((byte)local_38 & 0x1f)) == 0) {
                          ptr->bitmap[wbmp._4_4_] = 0;
                        }
                        else {
                          ptr->bitmap[wbmp._4_4_] = 1;
                        }
                        wbmp._4_4_ = wbmp._4_4_ + 1;
                      }
                      pel = pel + 1;
                    }
                  }
                }
                *return_wbmp = ptr;
                getin_local._4_4_ = 0;
              }
            }
            else {
              gdFree(ptr);
              getin_local._4_4_ = -1;
            }
          }
        }
      }
      else {
        gdFree(ptr);
        getin_local._4_4_ = -1;
      }
    }
    else {
      gdFree(ptr);
      getin_local._4_4_ = -1;
    }
  }
  return getin_local._4_4_;
}

Assistant:

int readwbmp(int (*getin) (void *in), void *in, Wbmp **return_wbmp)
{
	int row, col, byte, pel, pos;
	Wbmp *wbmp;

	if((wbmp = (Wbmp *)gdMalloc(sizeof(Wbmp))) == NULL) {
		return -1;
	}

	wbmp->type = getin(in);
	if(wbmp->type != 0) {
		gdFree(wbmp);
		return -1;
	}

	if(skipheader(getin, in)) {
		gdFree(wbmp);
		return -1;
	}

	wbmp->width = getmbi(getin, in);
	if(wbmp->width == -1) {
		gdFree(wbmp);
		return -1;
	}

	wbmp->height = getmbi(getin, in);
	if(wbmp->height == -1) {
		gdFree(wbmp);
		return -1;
	}

#ifdef __DEBUG
	printf("W: %d, H: %d\n", wbmp->width, wbmp->height);
#endif

	if(	overflow2(sizeof(int), wbmp->width) ||
		overflow2(sizeof(int) * wbmp->width, wbmp->height)) {
		gdFree(wbmp);
		return -1;
	}

	if((wbmp->bitmap = (int *)gdMalloc(sizeof(int) * wbmp->width * wbmp->height)) == NULL) {
		gdFree(wbmp);
		return -1;
	}

#ifdef __DEBUG
	printf("DATA CONSTRUCTED\n");
#endif

	pos = 0;
	for(row = 0; row < wbmp->height; row++) {
		for(col = 0; col < wbmp->width;) {
			byte = getin(in);

			for(pel = 7; pel >= 0; pel--) {
				if(col++ < wbmp->width) {
					if(byte & 1 << pel) {
						wbmp->bitmap[pos] = WBMP_WHITE;
					} else {
						wbmp->bitmap[pos] = WBMP_BLACK;
					}
					pos++;
				}
			}
		}
	}

	*return_wbmp = wbmp;

	return 0;
}